

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

_Bool ggml_op_can_inplace(ggml_op op)

{
  ggml_op op_local;
  _Bool local_1;
  
  switch(op) {
  case GGML_OP_ADD:
  case GGML_OP_ADD1:
  case GGML_OP_SUB:
  case GGML_OP_MUL:
  case GGML_OP_DIV:
  case GGML_OP_SQR:
  case GGML_OP_SQRT:
  case GGML_OP_LOG:
  case GGML_OP_SILU_BACK:
  case GGML_OP_RMS_NORM:
  case GGML_OP_RMS_NORM_BACK:
  case GGML_OP_SCALE:
  case GGML_OP_DIAG_MASK_INF:
  case GGML_OP_DIAG_MASK_ZERO:
  case GGML_OP_SOFT_MAX:
  case GGML_OP_SOFT_MAX_BACK:
  case GGML_OP_ROPE:
  case GGML_OP_ROPE_BACK:
  case GGML_OP_UNARY:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ggml_op_can_inplace(enum ggml_op op) {
    switch (op) {
        case GGML_OP_SCALE:
        case GGML_OP_DIAG_MASK_ZERO:
        case GGML_OP_DIAG_MASK_INF:
        case GGML_OP_ADD:
        case GGML_OP_ADD1:
        case GGML_OP_SUB:
        case GGML_OP_MUL:
        case GGML_OP_DIV:
        case GGML_OP_SQR:
        case GGML_OP_SQRT:
        case GGML_OP_LOG:
        case GGML_OP_UNARY:
        case GGML_OP_ROPE:
        case GGML_OP_ROPE_BACK:
        case GGML_OP_SILU_BACK:
        case GGML_OP_RMS_NORM:
        case GGML_OP_RMS_NORM_BACK:
        case GGML_OP_SOFT_MAX:
        case GGML_OP_SOFT_MAX_BACK:
            return true;

        default:
            return false;
    }
}